

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64.h
# Opt level: O1

void __thiscall
PMP_Multilinear_Hasher_64::randomize
          (PMP_Multilinear_Hasher_64 *this,UniformRandomNumberGenerator *rng)

{
  uint64_t *puVar1;
  ulong uVar2;
  random_data_for_PMPML_64 *prVar3;
  bool bVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  random_data_for_PMPML_64 *prVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  prVar8 = (random_data_for_PMPML_64 *)operator_new__(0x2100,0x20);
  lVar12 = 0;
  do {
    puVar1 = &prVar8[lVar12].cachedSumLow;
    lVar11 = 0;
    do {
      *puVar1 = 0;
      puVar1[1] = 0;
      do {
        lVar9 = (*(code *)**(undefined8 **)rng)(rng);
        prVar8[lVar12].random_coeff[lVar11] = lVar9 << 0x20;
        uVar5 = (*(code *)**(undefined8 **)rng)(rng);
        uVar10 = (ulong)uVar5 | prVar8[lVar12].random_coeff[lVar11];
        prVar8[lVar12].random_coeff[lVar11] = uVar10;
        bVar4 = uVar10 - 1 < 0xfffffffffffffff4;
        if (lVar12 == 0) {
          bVar4 = uVar10 != 0;
        }
      } while (!bVar4);
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar10;
      if (CARRY8(uVar2,uVar10)) {
        prVar8[lVar12].cachedSumHigh = prVar8[lVar12].cachedSumHigh + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x80);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  lVar12 = 0;
  do {
    uVar6 = (*(code *)**(undefined8 **)rng)(rng);
    uVar7 = (*(code *)**(undefined8 **)rng)(rng);
    *(ulong *)((long)prVar8->random_coeff + lVar12 + -0x20) = CONCAT44(uVar6,uVar7);
    lVar12 = lVar12 + 0x420;
  } while (lVar12 != 0x2100);
  prVar3 = this->curr_rd;
  if (prVar3 != (random_data_for_PMPML_64 *)0x0 && prVar3 != rd_for_PMPML_64) {
    operator_delete__(prVar3,0x20);
  }
  this->curr_rd = prVar8;
  return;
}

Assistant:

void randomize( UniformRandomNumberGenerator& rng )
  {
    random_data_for_PMPML_64 * temp_curr_rd = new random_data_for_PMPML_64[ PMPML_LEVELS_64 ];

	int i, j;
	for ( i=0; i<PMPML_LEVELS_64; i++ )
	{
		for ( j=0; j<PMPML_CHUNK_SIZE_64; j++ )
		{
			temp_curr_rd[ i ].cachedSumLow = 0;
			temp_curr_rd[ i ].cachedSumHigh = 0;
			do
			{
				temp_curr_rd[ i ].random_coeff[ j ] = rng.rand();
				temp_curr_rd[ i ].random_coeff[ j ] <<= 32;
				temp_curr_rd[ i ].random_coeff[ j ] |= rng.rand();
			}
			while ( !IS_VALID_COEFFICIENT_64( temp_curr_rd[ i ].random_coeff[ j ], i ) );
			uint64_t csl = temp_curr_rd[ i ].cachedSumLow;
			temp_curr_rd[ i ].cachedSumLow += temp_curr_rd[ i ].random_coeff[ j ];
			if ( temp_curr_rd[ i ].cachedSumLow < csl )
				temp_curr_rd[ i ].cachedSumHigh += 1;
		}
	}

	for ( i=0; i<PMPML_LEVELS_64; i++ )
	{
		uint64_t rv = rng.rand();
		rv <<= 32;
		rv += rng.rand();
		temp_curr_rd[ i ].const_term = rv;
	}

	if ( curr_rd == rd_for_PMPML_64 )
		curr_rd = temp_curr_rd;
	else
	{
		if ( curr_rd != NULL )
			delete [] curr_rd;
		curr_rd = temp_curr_rd;
	}
  }